

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * fxp_open_send(char *path,int type,fxp_attrs *attrs)

{
  fxp_attrs attrs_00;
  BinarySink *bs;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  unsigned_long local_38;
  sftp_packet *local_30;
  sftp_packet *pktout;
  sftp_request *req;
  fxp_attrs *attrs_local;
  char *pcStack_10;
  int type_local;
  char *path_local;
  
  req = (sftp_request *)attrs;
  attrs_local._4_4_ = type;
  pcStack_10 = path;
  pktout = (sftp_packet *)sftp_alloc_request();
  local_30 = sftp_pkt_init(3);
  BinarySink_put_uint32(local_30->binarysink_,(ulong)*(uint *)&pktout->data);
  BinarySink_put_stringz(local_30->binarysink_,pcStack_10);
  BinarySink_put_uint32(local_30->binarysink_,(long)attrs_local._4_4_);
  bs = local_30->binarysink_;
  if (req == (sftp_request *)0x0) {
    memcpy(&local_68,&no_attrs,0x38);
  }
  else {
    memcpy(&local_68,req,0x38);
  }
  attrs_00.size = uStack_60;
  attrs_00.flags = local_68;
  attrs_00.uid = local_58;
  attrs_00.gid = uStack_50;
  attrs_00.permissions = local_48;
  attrs_00.atime = uStack_40;
  attrs_00.mtime = local_38;
  BinarySink_put_fxp_attrs(bs,attrs_00);
  sftp_send(local_30);
  return (sftp_request *)pktout;
}

Assistant:

struct sftp_request *fxp_open_send(const char *path, int type,
                                   const struct fxp_attrs *attrs)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_OPEN);
    put_uint32(pktout, req->id);
    put_stringz(pktout, path);
    put_uint32(pktout, type);
    put_fxp_attrs(pktout, attrs ? *attrs : no_attrs);
    sftp_send(pktout);

    return req;
}